

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

string * __thiscall
bloaty::(anonymous_namespace)::SiPrint_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int64_t size,bool force_sign)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  long *plVar5;
  string *psVar6;
  string *extraout_RAX;
  ulong uVar7;
  size_type *psVar8;
  _Alloc_hider _Var9;
  ulong uVar10;
  uint __len;
  bool bVar11;
  double d;
  double dVar12;
  string ret;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  _anonymous_namespace_ *local_40;
  string *local_38;
  
  cVar2 = (char)size;
  d = (double)(long)this;
  if (ABS(d) <= 1024.0) {
LAB_00174798:
    local_a8 = &local_60.field_2;
    local_60.field_2._M_local_buf[0] = '\0';
    local_60._M_string_length = 0;
    uVar10 = (ulong)d;
    uVar4 = -uVar10;
    if (0 < (long)uVar10) {
      uVar4 = uVar10;
    }
    __len = 1;
    if (9 < uVar4) {
      uVar7 = uVar4;
      uVar3 = 4;
      do {
        __len = uVar3;
        if (uVar7 < 100) {
          __len = __len - 2;
          goto LAB_00174879;
        }
        if (uVar7 < 1000) {
          __len = __len - 1;
          goto LAB_00174879;
        }
        if (uVar7 < 10000) goto LAB_00174879;
        bVar11 = 99999 < uVar7;
        uVar7 = uVar7 / 10000;
        uVar3 = __len + 4;
      } while (bVar11);
      __len = __len + 1;
    }
LAB_00174879:
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_60._M_dataplus._M_p = (pointer)local_a8;
    local_40 = this;
    local_38 = __return_storage_ptr__;
    std::__cxx11::string::_M_construct((ulong)&local_a0,(char)__len - (char)((long)uVar10 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_a0._M_dataplus._M_p + -((long)uVar10 >> 0x3f),__len,uVar4);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_a0);
    __return_storage_ptr__ = local_38;
    paVar1 = &local_80.field_2;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_80.field_2._M_allocated_capacity = *psVar8;
      local_80.field_2._8_8_ = plVar5[3];
      local_80._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar8;
      local_80._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_80._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (cVar2 != '\x01' || (long)local_40 < 1) goto LAB_00174a70;
    std::operator+(&local_80,"+",&local_60);
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_80);
    local_a0.field_2._M_allocated_capacity = local_80.field_2._M_allocated_capacity;
    _Var9._M_p = local_80._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == paVar1) goto LAB_00174a70;
  }
  else {
    uVar4 = 0;
    do {
      d = d * 0.0009765625;
      dVar12 = ABS(d);
      if (dVar12 <= 1024.0) break;
      bVar11 = uVar4 < 2;
      uVar4 = uVar4 + 1;
    } while (bVar11);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    if (100.0 < dVar12) goto LAB_00174798;
    if (dVar12 <= 10.0) {
      if (cVar2 == '\0') {
        DoubleStringPrintf_abi_cxx11_(&local_a0,(_anonymous_namespace_ *)"%0.2f",(char *)size,d);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_a0);
      }
      else {
        DoubleStringPrintf_abi_cxx11_(&local_a0,(_anonymous_namespace_ *)"%+0.2f",(char *)size,d);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_a0);
      }
    }
    else if (cVar2 == '\0') {
      DoubleStringPrintf_abi_cxx11_(&local_a0,(_anonymous_namespace_ *)"%0.1f",(char *)size,d);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_a0);
    }
    else {
      DoubleStringPrintf_abi_cxx11_(&local_a0,(_anonymous_namespace_ *)"%+0.1f",(char *)size,d);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_a0);
    }
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_80.field_2._M_allocated_capacity = *psVar8;
      local_80.field_2._8_8_ = plVar5[3];
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar8;
      local_80._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_80._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    _Var9._M_p = local_a0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == &local_a0.field_2) goto LAB_00174a70;
  }
  operator_delete(_Var9._M_p,local_a0.field_2._M_allocated_capacity + 1);
LAB_00174a70:
  psVar6 = anon_unknown_35::LeftPad
                     (__return_storage_ptr__,(anon_unknown_35 *)local_60._M_dataplus._M_p,
                      (string *)local_60._M_string_length,7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
    psVar6 = extraout_RAX;
  }
  return psVar6;
}

Assistant:

std::string SiPrint(int64_t size, bool force_sign) {
  const char* prefixes[] = {"", "Ki", "Mi", "Gi", "Ti"};
  size_t num_prefixes = 5;
  size_t n = 0;
  double size_d = size;
  while (fabs(size_d) > 1024 && n < num_prefixes - 2) {
    size_d /= 1024;
    n++;
  }

  std::string ret;

  if (fabs(size_d) > 100 || n == 0) {
    ret = std::to_string(static_cast<int64_t>(size_d)) + prefixes[n];
    if (force_sign && size > 0) {
      ret = "+" + ret;
    }
  } else if (fabs(size_d) > 10) {
    if (force_sign) {
      ret = DoubleStringPrintf("%+0.1f", size_d) + prefixes[n];
    } else {
      ret = DoubleStringPrintf("%0.1f", size_d) + prefixes[n];
    }
  } else {
    if (force_sign) {
      ret = DoubleStringPrintf("%+0.2f", size_d) + prefixes[n];
    } else {
      ret = DoubleStringPrintf("%0.2f", size_d) + prefixes[n];
    }
  }

  return LeftPad(ret, 7);
}